

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  element_type *peVar4;
  long in_RSI;
  ostream *in_RDI;
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  AssertionPrinter *in_stack_00000290;
  undefined1 in_stack_ffffffffffffff7f;
  AssertionResult *in_stack_ffffffffffffff80;
  AssertionPrinter *in_stack_ffffffffffffff90;
  undefined1 local_60 [96];
  
  local_60._64_8_ = in_RSI + 8;
  local_60[0x3f] = 1;
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13c027);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[5])();
  if (((uVar2 & 1) == 0) && (bVar1 = AssertionResult::isOk(in_stack_ffffffffffffff80), bVar1)) {
    OVar3 = AssertionResult::getResultType((AssertionResult *)local_60._64_8_);
    if (OVar3 != Warning) {
      local_60[0x5f] = 0;
      goto LAB_0013c0d8;
    }
    local_60[0x3f] = 0;
  }
  anon_unknown_1::AssertionPrinter::AssertionPrinter
            (in_stack_ffffffffffffff90,in_RDI,(AssertionStats *)local_60,
             (bool)in_stack_ffffffffffffff7f);
  anon_unknown_1::AssertionPrinter::print(in_stack_00000290);
  std::ostream::operator<<(*(void **)(in_RDI + 0x18),std::endl<char,std::char_traits<char>>);
  local_60[0x5f] = 1;
  anon_unknown_1::AssertionPrinter::~AssertionPrinter((AssertionPrinter *)0x13c0bc);
LAB_0013c0d8:
  return (bool)(local_60[0x5f] & 1);
}

Assistant:

bool CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();

            stream << std::endl;
            return true;
        }